

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O0

string * __thiscall
t_c_glib_generator::property_type_name_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype,bool in_typedef,
          bool is_const)

{
  uint uVar1;
  t_base tVar2;
  string local_78;
  string local_58;
  undefined1 local_23;
  byte local_22;
  byte local_21;
  bool is_const_local;
  t_base_type *ptStack_20;
  bool in_typedef_local;
  t_type *ttype_local;
  t_c_glib_generator *this_local;
  string *result;
  
  local_23 = 0;
  local_22 = is_const;
  local_21 = in_typedef;
  ptStack_20 = (t_base_type *)ttype;
  ttype_local = (t_type *)this;
  this_local = (t_c_glib_generator *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  uVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[5])();
  if ((uVar1 & 1) == 0) {
    type_name_abi_cxx11_
              (&local_78,this,&ptStack_20->super_t_type,(bool)(local_21 & 1),(bool)(local_22 & 1));
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
  }
  else {
    tVar2 = t_base_type::get_base(ptStack_20);
    if (tVar2 - TYPE_I8 < 3) {
      if ((local_22 & 1) == 0) {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"gint");
      }
      else {
        std::__cxx11::string::operator=((string *)__return_storage_ptr__,"const gint");
      }
    }
    else {
      type_name_abi_cxx11_
                (&local_58,this,&ptStack_20->super_t_type,(bool)(local_21 & 1),(bool)(local_22 & 1))
      ;
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::property_type_name(t_type* ttype, bool in_typedef, bool is_const) {
  string result;

  if (ttype->is_base_type()) {
    switch (((t_base_type*)ttype)->get_base()) {
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
      if (is_const) {
        result = "const gint";
      } else {
        result = "gint";
      }
      break;

    default:
      result = type_name(ttype, in_typedef, is_const);
    }
  } else {
    result = type_name(ttype, in_typedef, is_const);
  }

  return result;
}